

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_push_v(DisasContext *s,TCGv_i64 val)

{
  TCGContext *pTVar1;
  TCGArg a2;
  MemOp memop;
  TCGTemp *ts;
  uintptr_t o_1;
  TCGv_i64 pTVar2;
  MemOp MVar3;
  uintptr_t o;
  bool bVar4;
  TCGv_i64 local_40;
  
  pTVar1 = s->uc->tcg_ctx;
  MVar3 = s->dflag;
  bVar4 = s->code64 == 0;
  memop = (MVar3 != MO_16) + 1 + (uint)(MVar3 != MO_16);
  if (bVar4) {
    memop = MVar3;
  }
  MVar3 = MO_64;
  if (bVar4) {
    MVar3 = MO_32 - (s->ss32 == 0);
  }
  local_40 = s->A0;
  tcg_gen_subi_i64_x86_64(pTVar1,local_40,pTVar1->cpu_regs[4],(long)(1 << ((byte)memop & 0x1f)));
  if (s->code64 == 0) {
    pTVar2 = s->A0;
    if ((s->addseg != 0) && (local_40 = s->tmp4, local_40 != pTVar2)) {
      tcg_gen_op2_x86_64(pTVar1,INDEX_op_mov_i64,(TCGArg)(local_40 + (long)pTVar1),
                         (TCGArg)(pTVar2 + (long)pTVar1));
      pTVar2 = s->A0;
    }
    gen_lea_v_seg(s,MVar3,pTVar2,2,-1);
  }
  pTVar2 = s->A0;
  pTVar1 = s->uc->tcg_ctx;
  if (s->uc->hook[0xb].head != (list_item *)0x0) {
    a2 = s->prev_pc;
    ts = tcg_temp_new_internal_x86_64(pTVar1,TCG_TYPE_I64,false);
    tcg_gen_op2_x86_64(pTVar1,INDEX_op_movi_i64,(TCGArg)ts,a2);
    tcg_gen_op3_x86_64(pTVar1,INDEX_op_st_i64,(TCGArg)ts,(TCGArg)(pTVar1->cpu_env + (long)pTVar1),
                       0x80);
    tcg_temp_free_internal_x86_64(pTVar1,ts);
  }
  tcg_gen_qemu_st_i64_x86_64(pTVar1,val,pTVar2,(long)s->mem_index,memop);
  gen_op_mov_reg_v(s,MVar3,4,local_40);
  return;
}

Assistant:

static void gen_push_v(DisasContext *s, TCGv val)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    MemOp d_ot = mo_pushpop(s, s->dflag);
    MemOp a_ot = mo_stacksize(s);
    int size = 1 << d_ot;
    TCGv new_esp = s->A0;

    tcg_gen_subi_tl(tcg_ctx, s->A0, tcg_ctx->cpu_regs[R_ESP], size);

    if (!CODE64(s)) {
        if (s->addseg) {
            new_esp = s->tmp4;
            tcg_gen_mov_tl(tcg_ctx, new_esp, s->A0);
        }
        gen_lea_v_seg(s, a_ot, s->A0, R_SS, -1);
    }

    gen_op_st_v(s, d_ot, val, s->A0);
    gen_op_mov_reg_v(s, a_ot, R_ESP, new_esp);
}